

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aio.cpp
# Opt level: O3

int main(void)

{
  char cVar1;
  ostream *poVar2;
  size_t in_RCX;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  ulong uVar3;
  float fVar4;
  Aio aio;
  Aio local_38;
  
  signal(2,sig_handler);
  uVar3 = 0;
  mraa::Aio::Aio(&local_38,0);
  __buf = extraout_RDX;
  while (flag != 0) {
    mraa::Aio::read(&local_38,(int)uVar3,__buf,in_RCX);
    fVar4 = mraa::Aio::readFloat(&local_38);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ADC A0 read %X - %d",0x13);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ADC A0 read float - %.5f",0x18);
    poVar2 = std::ostream::_M_insert<double>((double)fVar4);
    cVar1 = std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    uVar3 = (ulong)(uint)(int)cVar1;
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    __buf = extraout_RDX_00;
  }
  mraa::Aio::~Aio(&local_38);
  return 0;
}

Assistant:

int
main(void)
{
    uint16_t value;
    float float_value;

    signal(SIGINT, sig_handler);

    //! [Interesting]
    /* initialize AIO */
    mraa::Aio aio(AIO_PORT);

    while (flag) {
        value = aio.read();
        float_value = aio.readFloat();
        std::cout << "ADC A0 read %X - %d" << value << value << std::endl;
        std::cout << "ADC A0 read float - %.5f" << float_value << std::endl;
    }
    //! [Interesting]

    return EXIT_SUCCESS;
}